

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_ffmpeg.c
# Opt level: O2

int ffmpeg_set_channel_map(input_handle *ih,int *st)

{
  AVCodecContext *pAVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  
  pAVar1 = ih->codec_context;
  uVar2 = pAVar1->channel_layout;
  if (uVar2 != 0) {
    uVar4 = 0;
    bVar3 = 0;
    while (uVar4 < (uint)pAVar1->channels) {
      iVar5 = 1 << (bVar3 & 0x1f);
      if ((uVar2 & (long)iVar5) != 0) {
        if (1 < iVar5 - 1U) {
          if (iVar5 == 0x20) {
            iVar5 = 5;
          }
          else if (iVar5 == 0x10) {
            iVar5 = 4;
          }
          else if (iVar5 == 4) {
            iVar5 = 3;
          }
          else {
            iVar5 = 0;
          }
        }
        st[uVar4] = iVar5;
        uVar4 = uVar4 + 1;
      }
      bVar3 = bVar3 + 1;
    }
    return 0;
  }
  return 1;
}

Assistant:

static int
ffmpeg_set_channel_map(struct input_handle *ih, int *st)
{
	if (!ih->codec_context->channel_layout) {
		return 1;
	}

	unsigned int channel_map_index = 0;
	int bit_counter = 0;
	while (channel_map_index < (unsigned)ih->codec_context->channels) {
		if (ih->codec_context->channel_layout & (1 << bit_counter)) {
			switch (1 << bit_counter) {
			case AV_CH_FRONT_LEFT:
				st[channel_map_index] = EBUR128_LEFT;
				break;
			case AV_CH_FRONT_RIGHT:
				st[channel_map_index] = EBUR128_RIGHT;
				break;
			case AV_CH_FRONT_CENTER:
				st[channel_map_index] = EBUR128_CENTER;
				break;
			case AV_CH_BACK_LEFT:
				st[channel_map_index] = EBUR128_LEFT_SURROUND;
				break;
			case AV_CH_BACK_RIGHT:
				st[channel_map_index] = EBUR128_RIGHT_SURROUND;
				break;
			default:
				st[channel_map_index] = EBUR128_UNUSED;
				break;
			}
			++channel_map_index;
		}
		++bit_counter;
	}

	return 0;
}